

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O2

void info_print_flags(lyout *out,uint16_t flags,uint16_t mask,int is_list)

{
  char *pcVar1;
  char *pcVar2;
  
  if ((mask & 3) != 0) {
    ly_print(out,"%-*s",0xb,"Config: ");
    pcVar2 = "read-only\n";
    if ((flags & 2) == 0) {
      pcVar2 = "read-write\n";
    }
    ly_print(out,pcVar2);
  }
  if ((mask & 0x38) != 0) {
    ly_print(out,"%-*s",0xb,"Status: ");
    pcVar2 = "obsolete\n";
    if ((flags & 0x20) == 0) {
      pcVar2 = "current\n";
    }
    pcVar1 = "deprecated\n";
    if ((flags & 0x10) == 0) {
      pcVar1 = pcVar2;
    }
    ly_print(out,pcVar1);
  }
  if ((mask & 0xc0) != 0) {
    ly_print(out,"%-*s",0xb,"Mandatory: ");
    pcVar2 = "yes\n";
    if ((flags & 0x40) == 0) {
      pcVar2 = "no\n";
    }
    ly_print(out,pcVar2);
  }
  if ((mask >> 8 & 1) == 0 || is_list == 0) {
    if (is_list != 0 || (mask >> 8 & 1) == 0) {
      return;
    }
    ly_print(out,"%-*s",0xb,"Enabled: ");
    pcVar1 = "no\n";
    pcVar2 = "yes\n";
  }
  else {
    ly_print(out,"%-*s",0xb,"Order: ");
    pcVar1 = "system-ordered\n";
    pcVar2 = "user-ordered\n";
  }
  if ((flags >> 8 & 1) == 0) {
    pcVar2 = pcVar1;
  }
  ly_print(out,pcVar2);
  return;
}

Assistant:

static void
info_print_flags(struct lyout *out, uint16_t flags, uint16_t mask, int is_list)
{
    if (mask & LYS_CONFIG_MASK) {
        ly_print(out, "%-*s", INDENT_LEN, "Config: ");
        if (flags & LYS_CONFIG_R) {
            ly_print(out, "read-only\n");
        } else {
            ly_print(out, "read-write\n");
        }
    }

    if (mask & LYS_STATUS_MASK) {
        ly_print(out, "%-*s", INDENT_LEN, "Status: ");

        if (flags & LYS_STATUS_DEPRC) {
            ly_print(out, "deprecated\n");
        } else if (flags & LYS_STATUS_OBSLT) {
            ly_print(out, "obsolete\n");
        } else {
            ly_print(out, "current\n");
        }
    }

    if (mask & LYS_MAND_MASK) {
        ly_print(out, "%-*s", INDENT_LEN, "Mandatory: ");

        if (flags & LYS_MAND_TRUE) {
            ly_print(out, "yes\n");
        } else {
            ly_print(out, "no\n");
        }
    }

    if (is_list && (mask & LYS_USERORDERED)) {
        ly_print(out, "%-*s", INDENT_LEN, "Order: ");

        if (flags & LYS_USERORDERED) {
            ly_print(out, "user-ordered\n");
        } else {
            ly_print(out, "system-ordered\n");
        }
    }

    if (!is_list && (mask & LYS_FENABLED)) {
        ly_print(out, "%-*s", INDENT_LEN, "Enabled: ");

        if (flags & LYS_FENABLED) {
            ly_print(out, "yes\n");
        } else {
            ly_print(out, "no\n");
        }
    }
}